

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::getTlsOssResult(void)

{
  String *in_RDI;
  string *in;
  String *this;
  string local_28 [40];
  
  this = in_RDI;
  g_oss_abi_cxx11_();
  in = local_28;
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::c_str();
  String::String(this,(char *)in);
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

String getTlsOssResult() {
        //g_oss << std::ends; // needed - as shown here: https://stackoverflow.com/a/624291/3162383
        return g_oss.str().c_str();
    }